

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryOperatorOverloadTest.cpp
# Opt level: O3

void __thiscall
TEST_MemoryLeakOverridesToBeUsedInProductionCode_UseNativeMallocByTemporarlySwitchingOffMalloc_Test
::testBody(TEST_MemoryLeakOverridesToBeUsedInProductionCode_UseNativeMallocByTemporarlySwitchingOffMalloc_Test
           *this)

{
  size_t sVar1;
  UtestShell *pUVar2;
  size_t sVar3;
  TestTerminator *pTVar4;
  
  sVar1 = MemoryLeakDetector::totalMemoryLeaks
                    ((this->
                     super_TEST_GROUP_CppUTestGroupMemoryLeakOverridesToBeUsedInProductionCode).
                     memLeakDetector,mem_leak_period_checking);
  pUVar2 = UtestShell::getCurrent();
  sVar3 = MemoryLeakDetector::totalMemoryLeaks
                    ((this->
                     super_TEST_GROUP_CppUTestGroupMemoryLeakOverridesToBeUsedInProductionCode).
                     memLeakDetector,mem_leak_period_checking);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[0xe])
            (pUVar2,sVar1,sVar3,
             "LONGS_EQUAL(memLeaks, memLeakDetector->totalMemoryLeaks(mem_leak_period_checking)) failed"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryOperatorOverloadTest.cpp"
             ,0xcd,pTVar4);
  return;
}

Assistant:

TEST(MemoryLeakOverridesToBeUsedInProductionCode, UseNativeMallocByTemporarlySwitchingOffMalloc)
{
    size_t memLeaks = memLeakDetector->totalMemoryLeaks(mem_leak_period_checking);
#ifdef CPPUTEST_USE_MALLOC_MACROS
    #undef malloc
    #undef free
#endif

#if CPPUTEST_USE_STD_C_LIB
    void* memory = malloc(10);
    LONGS_EQUAL(memLeaks, memLeakDetector->totalMemoryLeaks(mem_leak_period_checking));
    free (memory);
#else
    void* memory = PlatformSpecificMalloc(10);
    LONGS_EQUAL(memLeaks, memLeakDetector->totalMemoryLeaks(mem_leak_period_checking));
    PlatformSpecificFree (memory);
#endif

#ifdef CPPUTEST_USE_MALLOC_MACROS
#include "CppUTest/MemoryLeakDetectorMallocMacros.h"
#endif
}